

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-util.cc
# Opt level: O0

Arities __thiscall wabt::ModuleContext::GetExprArity(ModuleContext *this,Expr *expr)

{
  FILE *__stream;
  ExprType EVar1;
  Index IVar2;
  Index IVar3;
  Enum EVar4;
  BlockExprBase<(wabt::ExprType)8> *pBVar5;
  VarExpr<(wabt::ExprType)9> *pVVar6;
  VarExpr<(wabt::ExprType)10> *pVVar7;
  BrTableExpr *pBVar8;
  VarExpr<(wabt::ExprType)12> *pVVar9;
  VarExpr<(wabt::ExprType)40> *pVVar10;
  CallIndirectExpr *pCVar11;
  CallRefExpr *pCVar12;
  ReturnCallIndirectExpr *pRVar13;
  IfExpr *pIVar14;
  BlockExprBase<(wabt::ExprType)27> *pBVar15;
  VarExpr<(wabt::ExprType)59> *pVVar16;
  size_type sVar17;
  TryExpr *pTVar18;
  TryTableExpr *pTVar19;
  SimdLaneOpExpr *pSVar20;
  char *pcVar21;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 extraout_RDX_19;
  undefined8 extraout_RDX_20;
  undefined8 extraout_RDX_21;
  undefined8 extraout_RDX_22;
  undefined8 extraout_RDX_23;
  undefined8 extraout_RDX_24;
  undefined8 extraout_RDX_25;
  undefined8 extraout_RDX_26;
  undefined8 extraout_RDX_27;
  undefined8 extraout_RDX_28;
  undefined8 extraout_RDX_29;
  undefined8 extraout_RDX_30;
  undefined8 uVar22;
  Arities AVar23;
  Opcode local_74;
  Tag *pTStack_70;
  Opcode opcode;
  Tag *tag;
  Index operand_count;
  VarExpr<(wabt::ExprType)59> *throw_;
  ReturnCallIndirectExpr *rci_expr;
  Var *var_2;
  CallIndirectExpr *ci_expr;
  Var *var_1;
  Var *var;
  Index arity;
  Expr *expr_local;
  ModuleContext *this_local;
  undefined4 uStack_10;
  undefined1 local_c;
  
  EVar1 = Expr::type(expr);
  switch(EVar1) {
  case AtomicLoad:
  case Convert:
  case Load:
  case LocalTee:
  case MemoryGrow:
  case RefIsNull:
  case LoadSplat:
  case LoadZero:
  case TableGet:
  case Unary:
    Arities::Arities((Arities *)((long)&this_local + 4),1,1,false);
    uVar22 = extraout_RDX_14;
    break;
  case AtomicRmw:
  case AtomicNotify:
  case Binary:
  case Compare:
  case TableGrow:
    Arities::Arities((Arities *)((long)&this_local + 4),2,1,false);
    uVar22 = extraout_RDX;
    break;
  case AtomicRmwCmpxchg:
  case AtomicWait:
  case Select:
    Arities::Arities((Arities *)((long)&this_local + 4),3,1,false);
    uVar22 = extraout_RDX_21;
    break;
  case AtomicStore:
  case Store:
  case TableSet:
    Arities::Arities((Arities *)((long)&this_local + 4),2,0,false);
    uVar22 = extraout_RDX_00;
    break;
  case AtomicFence:
  case CodeMetadata:
  case DataDrop:
  case ElemDrop:
    Arities::Arities((Arities *)((long)&this_local + 4),0,0,false);
    uVar22 = extraout_RDX_12;
    break;
  case Block:
    pBVar5 = cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(expr);
    IVar3 = FuncSignature::GetNumResults(&(pBVar5->block).decl.sig);
    Arities::Arities((Arities *)((long)&this_local + 4),0,IVar3,false);
    uVar22 = extraout_RDX_01;
    break;
  case Br:
    pVVar6 = cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(expr);
    IVar3 = GetLabelArity(this,&pVVar6->var);
    Arities::Arities((Arities *)((long)&this_local + 4),IVar3,1,true);
    uVar22 = extraout_RDX_02;
    break;
  case BrIf:
    pVVar7 = cast<wabt::VarExpr<(wabt::ExprType)10>,wabt::Expr>(expr);
    IVar3 = GetLabelArity(this,&pVVar7->var);
    Arities::Arities((Arities *)((long)&this_local + 4),IVar3 + 1,IVar3,false);
    uVar22 = extraout_RDX_03;
    break;
  case BrTable:
    pBVar8 = cast<wabt::BrTableExpr,wabt::Expr>(expr);
    IVar3 = GetLabelArity(this,&pBVar8->default_target);
    Arities::Arities((Arities *)((long)&this_local + 4),IVar3 + 1,1,true);
    uVar22 = extraout_RDX_04;
    break;
  case Call:
    pVVar9 = cast<wabt::VarExpr<(wabt::ExprType)12>,wabt::Expr>(expr);
    IVar3 = GetFuncParamCount(this,&pVVar9->var);
    IVar2 = GetFuncResultCount(this,&pVVar9->var);
    Arities::Arities((Arities *)((long)&this_local + 4),IVar3,IVar2,false);
    uVar22 = extraout_RDX_05;
    break;
  case CallIndirect:
    pCVar11 = cast<wabt::CallIndirectExpr,wabt::Expr>(expr);
    IVar3 = FuncDeclaration::GetNumParams(&pCVar11->decl);
    IVar2 = FuncDeclaration::GetNumResults(&pCVar11->decl);
    Arities::Arities((Arities *)((long)&this_local + 4),IVar3 + 1,IVar2,false);
    uVar22 = extraout_RDX_07;
    break;
  case CallRef:
    pCVar12 = cast<wabt::CallRefExpr,wabt::Expr>(expr);
    IVar3 = GetFuncParamCount(this,&pCVar12->function_type_index);
    IVar2 = GetFuncResultCount(this,&pCVar12->function_type_index);
    Arities::Arities((Arities *)((long)&this_local + 4),IVar3 + 1,IVar2,false);
    uVar22 = extraout_RDX_08;
    break;
  case Const:
  case GlobalGet:
  case LocalGet:
  case MemorySize:
  case RefFunc:
  case RefNull:
  case TableSize:
    Arities::Arities((Arities *)((long)&this_local + 4),0,1,false);
    uVar22 = extraout_RDX_10;
    break;
  case Drop:
  case GlobalSet:
  case LocalSet:
    Arities::Arities((Arities *)((long)&this_local + 4),1,0,false);
    uVar22 = extraout_RDX_15;
    break;
  case If:
    pIVar14 = cast<wabt::IfExpr,wabt::Expr>(expr);
    IVar3 = FuncSignature::GetNumResults(&(pIVar14->true_).decl.sig);
    Arities::Arities((Arities *)((long)&this_local + 4),1,IVar3,false);
    uVar22 = extraout_RDX_16;
    break;
  case Loop:
    pBVar15 = cast<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Expr>(expr);
    IVar3 = FuncSignature::GetNumResults(&(pBVar15->block).decl.sig);
    Arities::Arities((Arities *)((long)&this_local + 4),0,IVar3,false);
    uVar22 = extraout_RDX_17;
    break;
  case MemoryCopy:
  case MemoryFill:
  case MemoryInit:
  case TableCopy:
  case TableInit:
  case TableFill:
    Arities::Arities((Arities *)((long)&this_local + 4),3,0,false);
    uVar22 = extraout_RDX_13;
    break;
  case Nop:
    Arities::Arities((Arities *)((long)&this_local + 4),0,0,false);
    uVar22 = extraout_RDX_18;
    break;
  case Rethrow:
    Arities::Arities((Arities *)((long)&this_local + 4),0,0,true);
    uVar22 = extraout_RDX_20;
    break;
  case Return:
    sVar17 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                       (&(this->current_func_->decl).sig.result_types);
    Arities::Arities((Arities *)((long)&this_local + 4),(Index)sVar17,1,true);
    uVar22 = extraout_RDX_19;
    break;
  case ReturnCall:
    pVVar10 = cast<wabt::VarExpr<(wabt::ExprType)40>,wabt::Expr>(expr);
    IVar3 = GetFuncParamCount(this,&pVVar10->var);
    IVar2 = GetFuncResultCount(this,&pVVar10->var);
    Arities::Arities((Arities *)((long)&this_local + 4),IVar3,IVar2,true);
    uVar22 = extraout_RDX_06;
    break;
  case ReturnCallIndirect:
    pRVar13 = cast<wabt::ReturnCallIndirectExpr,wabt::Expr>(expr);
    IVar3 = FuncDeclaration::GetNumParams(&pRVar13->decl);
    IVar2 = FuncDeclaration::GetNumResults(&pRVar13->decl);
    Arities::Arities((Arities *)((long)&this_local + 4),IVar3 + 1,IVar2,true);
    uVar22 = extraout_RDX_09;
    break;
  case SimdLaneOp:
    pSVar20 = cast<wabt::SimdLaneOpExpr,wabt::Expr>(expr);
    local_74.enum_ = (pSVar20->opcode).enum_;
    EVar4 = Opcode::operator_cast_to_Enum(&local_74);
    __stream = _stderr;
    if (EVar4 - I8X16ExtractLaneS < 2) {
LAB_001c59ab:
      Arities::Arities((Arities *)((long)&this_local + 4),1,1,false);
      uVar22 = extraout_RDX_27;
    }
    else {
      if (EVar4 != I8X16ReplaceLane) {
        if (EVar4 - I16X8ExtractLaneS < 2) goto LAB_001c59ab;
        if (EVar4 != I16X8ReplaceLane) {
          if (EVar4 == I32X4ExtractLane) goto LAB_001c59ab;
          if (EVar4 != I32X4ReplaceLane) {
            if (EVar4 == I64X2ExtractLane) goto LAB_001c59ab;
            if (EVar4 != I64X2ReplaceLane) {
              if (EVar4 == F32X4ExtractLane) goto LAB_001c59ab;
              if (EVar4 != F32X4ReplaceLane) {
                if (EVar4 == F64X2ExtractLane) goto LAB_001c59ab;
                if (EVar4 != F64X2ReplaceLane) {
                  pcVar21 = GetExprTypeName(expr);
                  fprintf(__stream,"Invalid Opcode for expr type: %s\n",pcVar21);
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/ir-util.cc"
                                ,0x107,
                                "ModuleContext::Arities wabt::ModuleContext::GetExprArity(const Expr &) const"
                               );
                }
              }
            }
          }
        }
      }
      Arities::Arities((Arities *)((long)&this_local + 4),2,1,false);
      uVar22 = extraout_RDX_28;
    }
    break;
  case SimdLoadLane:
  case SimdStoreLane:
    Arities::Arities((Arities *)((long)&this_local + 4),2,1,false);
    uVar22 = extraout_RDX_29;
    break;
  case SimdShuffleOp:
    Arities::Arities((Arities *)((long)&this_local + 4),2,1,false);
    uVar22 = extraout_RDX_30;
    break;
  case Ternary:
    Arities::Arities((Arities *)((long)&this_local + 4),3,1,false);
    uVar22 = extraout_RDX_26;
    break;
  case Throw:
    pVVar16 = cast<wabt::VarExpr<(wabt::ExprType)59>,wabt::Expr>(expr);
    tag._4_4_ = 0;
    pTStack_70 = Module::GetTag(this->module,&pVVar16->var);
    if (pTStack_70 != (Tag *)0x0) {
      sVar17 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                         (&(pTStack_70->decl).sig.param_types);
      tag._4_4_ = (Index)sVar17;
    }
    Arities::Arities((Arities *)((long)&this_local + 4),tag._4_4_,0,true);
    uVar22 = extraout_RDX_22;
    break;
  case ThrowRef:
    Arities::Arities((Arities *)((long)&this_local + 4),1,1,true);
    uVar22 = extraout_RDX_23;
    break;
  case Try:
    pTVar18 = cast<wabt::TryExpr,wabt::Expr>(expr);
    IVar3 = FuncSignature::GetNumResults(&(pTVar18->block).decl.sig);
    Arities::Arities((Arities *)((long)&this_local + 4),0,IVar3,false);
    uVar22 = extraout_RDX_24;
    break;
  case TryTable:
    pTVar19 = cast<wabt::TryTableExpr,wabt::Expr>(expr);
    IVar3 = FuncSignature::GetNumResults(&(pTVar19->block).decl.sig);
    Arities::Arities((Arities *)((long)&this_local + 4),0,IVar3,false);
    uVar22 = extraout_RDX_25;
    break;
  case Last:
    Arities::Arities((Arities *)((long)&this_local + 4),0,1,true);
    uVar22 = extraout_RDX_11;
    break;
  default:
    abort();
  }
  AVar23._8_4_ = (undefined4)CONCAT71((int7)((ulong)uVar22 >> 8),local_c);
  AVar23.nargs = this_local._4_4_;
  AVar23.nreturns = uStack_10;
  return AVar23;
}

Assistant:

ModuleContext::Arities ModuleContext::GetExprArity(const Expr& expr) const {
  switch (expr.type()) {
    case ExprType::AtomicNotify:
    case ExprType::AtomicRmw:
    case ExprType::Binary:
    case ExprType::Compare:
    case ExprType::TableGrow:
      return {2, 1};

    case ExprType::AtomicStore:
    case ExprType::Store:
    case ExprType::TableSet:
      return {2, 0};

    case ExprType::Block:
      return {0, cast<BlockExpr>(&expr)->block.decl.sig.GetNumResults()};

    case ExprType::Br:
      return {GetLabelArity(cast<BrExpr>(&expr)->var), 1, true};

    case ExprType::BrIf: {
      Index arity = GetLabelArity(cast<BrIfExpr>(&expr)->var);
      return {arity + 1, arity};
    }

    case ExprType::BrTable:
      return {GetLabelArity(cast<BrTableExpr>(&expr)->default_target) + 1, 1,
              true};

    case ExprType::Call: {
      const Var& var = cast<CallExpr>(&expr)->var;
      return {GetFuncParamCount(var), GetFuncResultCount(var)};
    }

    case ExprType::ReturnCall: {
      const Var& var = cast<ReturnCallExpr>(&expr)->var;
      return {GetFuncParamCount(var), GetFuncResultCount(var), true};
    }

    case ExprType::CallIndirect: {
      const auto* ci_expr = cast<CallIndirectExpr>(&expr);
      return {ci_expr->decl.GetNumParams() + 1, ci_expr->decl.GetNumResults()};
    }

    case ExprType::CallRef: {
      const Var& var = cast<CallRefExpr>(&expr)->function_type_index;
      return {GetFuncParamCount(var) + 1, GetFuncResultCount(var)};
    }

    case ExprType::ReturnCallIndirect: {
      const auto* rci_expr = cast<ReturnCallIndirectExpr>(&expr);
      return {rci_expr->decl.GetNumParams() + 1, rci_expr->decl.GetNumResults(),
              true};
    }

    case ExprType::Const:
    case ExprType::GlobalGet:
    case ExprType::LocalGet:
    case ExprType::MemorySize:
    case ExprType::TableSize:
    case ExprType::RefNull:
    case ExprType::RefFunc:
      return {0, 1};

    case ExprType::Unreachable:
      return {0, 1, true};

    case ExprType::DataDrop:
    case ExprType::ElemDrop:
    case ExprType::AtomicFence:
    case ExprType::CodeMetadata:
      return {0, 0};

    case ExprType::MemoryInit:
    case ExprType::TableInit:
    case ExprType::MemoryFill:
    case ExprType::MemoryCopy:
    case ExprType::TableCopy:
    case ExprType::TableFill:
      return {3, 0};

    case ExprType::AtomicLoad:
    case ExprType::Convert:
    case ExprType::Load:
    case ExprType::LocalTee:
    case ExprType::MemoryGrow:
    case ExprType::Unary:
    case ExprType::TableGet:
    case ExprType::RefIsNull:
    case ExprType::LoadSplat:
    case ExprType::LoadZero:
      return {1, 1};

    case ExprType::Drop:
    case ExprType::GlobalSet:
    case ExprType::LocalSet:
      return {1, 0};

    case ExprType::If:
      return {1, cast<IfExpr>(&expr)->true_.decl.sig.GetNumResults()};

    case ExprType::Loop:
      return {0, cast<LoopExpr>(&expr)->block.decl.sig.GetNumResults()};

    case ExprType::Nop:
      return {0, 0};

    case ExprType::Return:
      return {static_cast<Index>(current_func_->decl.sig.result_types.size()),
              1, true};

    case ExprType::Rethrow:
      return {0, 0, true};

    case ExprType::AtomicRmwCmpxchg:
    case ExprType::AtomicWait:
    case ExprType::Select:
      return {3, 1};

    case ExprType::Throw: {
      auto throw_ = cast<ThrowExpr>(&expr);
      Index operand_count = 0;
      if (Tag* tag = module.GetTag(throw_->var)) {
        operand_count = tag->decl.sig.param_types.size();
      }
      return {operand_count, 0, true};
    }

    case ExprType::ThrowRef: {
      return {1, 1, true};
    }

    case ExprType::Try:
      return {0, cast<TryExpr>(&expr)->block.decl.sig.GetNumResults()};

    case ExprType::TryTable:
      return {0, cast<TryTableExpr>(&expr)->block.decl.sig.GetNumResults()};

    case ExprType::Ternary:
      return {3, 1};

    case ExprType::SimdLaneOp: {
      const Opcode opcode = cast<SimdLaneOpExpr>(&expr)->opcode;
      switch (opcode) {
        case Opcode::I8X16ExtractLaneS:
        case Opcode::I8X16ExtractLaneU:
        case Opcode::I16X8ExtractLaneS:
        case Opcode::I16X8ExtractLaneU:
        case Opcode::I32X4ExtractLane:
        case Opcode::I64X2ExtractLane:
        case Opcode::F32X4ExtractLane:
        case Opcode::F64X2ExtractLane:
          return {1, 1};

        case Opcode::I8X16ReplaceLane:
        case Opcode::I16X8ReplaceLane:
        case Opcode::I32X4ReplaceLane:
        case Opcode::I64X2ReplaceLane:
        case Opcode::F32X4ReplaceLane:
        case Opcode::F64X2ReplaceLane:
          return {2, 1};

        default:
          fprintf(stderr, "Invalid Opcode for expr type: %s\n",
                  GetExprTypeName(expr));
          assert(0);
          return {0, 0};
      }
    }

    case ExprType::SimdLoadLane:
    case ExprType::SimdStoreLane: {
      return {2, 1};
    }

    case ExprType::SimdShuffleOp:
      return {2, 1};
  }

  WABT_UNREACHABLE;
}